

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined1 auVar8 [16];
  int iVar9;
  parasail_result_t *ppVar10;
  int64_t *ptr;
  int64_t *ptr_00;
  ulong *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  ulong *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  bool bVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  ulong uVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ulong uVar38;
  ulong uVar39;
  __m128i_64_t B_1;
  undefined1 auVar40 [16];
  long lVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  undefined1 auVar41 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  __m128i_64_t B_3;
  long lVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  long lVar56;
  long lVar57;
  __m128i_64_t B_4;
  long lVar59;
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  __m128i_64_t B_5;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ulong uVar64;
  __m128i_64_t B;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i_64_t B_2;
  long lVar69;
  long lVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i vEndJ;
  __m128i vMaxH;
  ulong uStack_2c0;
  long lStack_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  long local_258;
  long local_250;
  ulong local_248;
  ulong uStack_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  ulong local_1b8;
  ulong uStack_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  long local_158;
  ulong local_150;
  ulong local_148;
  int64_t *local_140;
  long local_138;
  int *local_130;
  ulong local_128;
  int *local_120;
  int *local_118;
  ulong local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  ulong local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  int local_b8;
  undefined4 uStack_b4;
  int iStack_b0;
  undefined4 uStack_ac;
  long local_a8;
  long lStack_a0;
  ulong local_98;
  ulong uStack_90;
  undefined1 local_88 [16];
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_table_diag_sse41_128_64_cold_8();
  }
  else {
    uVar16 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_stats_table_diag_sse41_128_64_cold_7();
    }
    else if (open < 0) {
      parasail_sw_stats_table_diag_sse41_128_64_cold_6();
    }
    else if (gap < 0) {
      parasail_sw_stats_table_diag_sse41_128_64_cold_5();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_stats_table_diag_sse41_128_64_cold_4();
    }
    else {
      if (matrix->type == 1) {
        if (_s1 == (char *)0x0) {
          parasail_sw_stats_table_diag_sse41_128_64_cold_3();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        if (_s1 == (char *)0x0) {
          parasail_sw_stats_table_diag_sse41_128_64_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_stats_table_diag_sse41_128_64_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      if (matrix->type != 0) {
        _s1Len = matrix->length;
      }
      iVar21 = matrix->min;
      uVar25 = 0x8000000000000000 - (long)iVar21;
      if (iVar21 != -open && SBORROW4(iVar21,-open) == iVar21 + open < 0) {
        uVar25 = (ulong)(uint)open | 0x8000000000000000;
      }
      uVar11 = uVar25 + 1;
      local_228._8_8_ = local_228._0_8_;
      local_228._0_8_ = (long)matrix->max;
      auVar34._8_4_ = (int)uVar11;
      auVar34._0_8_ = uVar11;
      auVar34._12_4_ = (int)(uVar11 >> 0x20);
      local_298 = auVar34;
      local_288 = auVar34;
      local_278 = auVar34;
      local_268 = auVar34;
      local_218 = auVar34;
      local_168 = auVar34;
      ppVar10 = parasail_result_new_table3(_s1Len,s2Len);
      if (ppVar10 != (parasail_result_t *)0x0) {
        local_238._0_4_ = gap;
        ppVar10->flag = ppVar10->flag | 0x2831004;
        local_148 = uVar25;
        ptr = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
        uVar25 = (ulong)(s2Len + 2);
        ptr_00 = parasail_memalign_int64_t(0x10,uVar25);
        ptr_01 = (ulong *)parasail_memalign_int64_t(0x10,uVar25);
        ptr_02 = parasail_memalign_int64_t(0x10,uVar25);
        ptr_03 = parasail_memalign_int64_t(0x10,uVar25);
        ptr_04 = parasail_memalign_int64_t(0x10,uVar25);
        ptr_05 = (ulong *)parasail_memalign_int64_t(0x10,uVar25);
        ptr_06 = parasail_memalign_int64_t(0x10,uVar25);
        ptr_07 = parasail_memalign_int64_t(0x10,uVar25);
        ptr_08 = parasail_memalign_int64_t(0x10,uVar25);
        if ((ptr_08 != (int64_t *)0x0 &&
            (ptr_07 != (int64_t *)0x0 && (ptr_06 != (int64_t *)0x0 && ptr_05 != (ulong *)0x0))) &&
            ((ptr_04 != (int64_t *)0x0 && (ptr_03 != (int64_t *)0x0 && ptr_02 != (int64_t *)0x0)) &&
            ((ptr_01 != (ulong *)0x0 && ptr_00 != (int64_t *)0x0) && ptr != (int64_t *)0x0))) {
          local_158 = 0x7ffffffffffffffe - local_228._0_8_;
          uVar7 = local_238._0_4_;
          uVar25 = (ulong)_s1Len;
          if (0 < _s1Len) {
            piVar1 = matrix->mapper;
            uVar18 = 0;
            do {
              ptr[uVar18] = (long)piVar1[(byte)_s1[uVar18]];
              uVar18 = uVar18 + 1;
            } while (uVar25 != uVar18);
          }
          local_208._8_4_ = (int)local_158;
          local_208._0_8_ = local_158;
          local_208._12_4_ = (int)((ulong)local_158 >> 0x20);
          uStack_2c0 = auVar34._8_8_;
          local_d8 = uStack_2c0;
          uStack_d0 = 0;
          local_b8 = open;
          uStack_b4 = 0;
          iStack_b0 = open;
          uStack_ac = 0;
          local_c8._0_8_ = CONCAT44(0,local_238._0_4_);
          local_c8._8_4_ = local_238._0_4_;
          local_c8._12_4_ = 0;
          auVar8 = local_c8;
          ptr[uVar25] = 0;
          piVar1 = matrix->mapper;
          uVar18 = 1;
          if (1 < s2Len) {
            uVar18 = uVar16;
          }
          uVar22 = 0;
          do {
            ptr_00[uVar22 + 1] = (long)piVar1[(byte)_s2[uVar22]];
            uVar22 = uVar22 + 1;
          } while (uVar18 != uVar22);
          *ptr_00 = 0;
          ptr_00[uVar16 + 1] = 0;
          lVar23 = 0;
          do {
            *(undefined8 *)((long)ptr_01 + lVar23 + 8) = 0;
            *(undefined8 *)((long)ptr_02 + lVar23 + 8) = 0;
            *(undefined8 *)((long)ptr_03 + lVar23 + 8) = 0;
            *(undefined8 *)((long)ptr_04 + lVar23 + 8) = 0;
            *(ulong *)((long)ptr_05 + lVar23 + 8) = uVar11;
            *(undefined8 *)((long)ptr_06 + lVar23 + 8) = 0;
            *(undefined8 *)((long)ptr_07 + lVar23 + 8) = 0;
            *(undefined8 *)((long)ptr_08 + lVar23 + 8) = 0;
            lVar23 = lVar23 + 8;
          } while (uVar18 * 8 != lVar23);
          *ptr_01 = uVar11;
          *ptr_02 = 0;
          *ptr_03 = 0;
          *ptr_04 = 0;
          *ptr_05 = uVar11;
          *ptr_06 = 0;
          *ptr_07 = 0;
          *ptr_08 = 0;
          ptr_01[uVar16 + 1] = uVar11;
          ptr_02[uVar16 + 1] = 0;
          ptr_03[uVar16 + 1] = 0;
          ptr_04[uVar16 + 1] = 0;
          local_150 = uVar11;
          ptr_05[uVar16 + 1] = uVar11;
          ptr_06[uVar16 + 1] = 0;
          ptr_07[uVar16 + 1] = 0;
          ptr_08[uVar16 + 1] = 0;
          *ptr_01 = 0;
          local_178 = local_268;
          local_188 = local_278;
          local_198 = local_288;
          local_1a8 = local_298;
          if (_s1Len < 1) {
            local_248 = uVar11;
            uStack_240 = uStack_2c0;
          }
          else {
            local_130 = matrix->matrix;
            local_138 = uVar16 * 8;
            lVar23 = uVar16 * 4 + -4;
            auVar40 = pmovsxbq(ZEXT416((uint)local_238._0_4_),1);
            lVar20 = 0;
            uVar18 = 0;
            local_248 = uVar11;
            uStack_240 = uStack_2c0;
            local_140 = ptr_00;
            do {
              local_258 = lVar20;
              local_250 = lVar23;
              local_110 = uVar18 | 1;
              uStack_90 = ptr[uVar18];
              local_98 = ptr[uVar18 + 1];
              iVar21 = matrix->size;
              uVar12 = _s1Len - 1;
              if (local_110 < uVar25) {
                uVar12 = (uint)uVar18 | 1;
              }
              bVar31 = matrix->type != 0;
              local_128 = uVar18;
              uVar22 = uStack_90;
              if (bVar31) {
                uVar22 = uVar18;
              }
              uVar26 = (long)(int)uVar12;
              if (!bVar31) {
                uVar26 = local_98;
              }
              local_118 = local_130 + uVar22 * (long)iVar21;
              local_120 = local_130 + uVar26 * (long)iVar21;
              local_a8 = -(ulong)(auVar40._0_8_ < (long)uVar25);
              local_108 = auVar40;
              lVar42 = auVar40._8_8_;
              lStack_a0 = -(ulong)(lVar42 < (long)uVar25);
              local_238 = (undefined1  [16])0x0;
              uVar19 = 0;
              lVar53 = -1;
              lStack_2b0 = 0;
              local_f8 = (undefined1  [16])0x0;
              local_2a8 = (undefined1  [16])0x0;
              auVar62 = ZEXT816(0);
              auVar46 = (undefined1  [16])0x0;
              auVar61 = (undefined1  [16])0x0;
              local_228._8_8_ = uStack_2c0;
              local_228._0_8_ = uVar11;
              auVar71 = (undefined1  [16])0x0;
              auVar68 = (undefined1  [16])0x0;
              local_e8 = (undefined1  [16])0x0;
              lVar57 = 0;
              lVar59 = 0;
              uVar29 = uStack_2c0;
              uStack_70 = uStack_2c0;
              uVar64 = uStack_2c0;
              uVar33 = 0;
              uVar39 = uStack_2c0;
              uVar45 = 0;
              lVar56 = 0;
              lVar43 = 0;
              lVar69 = 0;
              lVar70 = 0;
              do {
                local_68 = uVar33;
                local_58._0_8_ = local_e8._8_8_;
                iVar2 = ptr_02[uVar19 + 1];
                local_58._8_8_ = iVar2;
                local_48._0_8_ = auVar68._8_8_;
                iVar3 = ptr_03[uVar19 + 1];
                local_48._8_8_ = iVar3;
                local_1c8._0_8_ = auVar71._8_8_;
                iVar4 = ptr_04[uVar19 + 1];
                local_1c8._8_8_ = iVar4;
                auVar66._8_8_ = ptr_06[uVar19 + 1];
                auVar66._0_8_ = local_2a8._8_8_;
                auVar63._8_8_ = ptr_07[uVar19 + 1];
                auVar63._0_8_ = local_f8._8_8_;
                uStack_60 = ptr_01[uVar19 + 1];
                uVar38 = local_68 - (uint)open;
                uVar44 = ptr_01[uVar19 + 1] - (ulong)(uint)open;
                local_c8._12_4_ = 0;
                local_c8._8_4_ = uVar7;
                uVar33 = uStack_70 - local_c8._0_8_;
                uVar37 = ptr_05[uVar19 + 1] - local_c8._8_8_;
                local_78 = uVar33;
                if ((long)uVar33 < (long)uVar38) {
                  local_78 = uVar38;
                }
                uStack_70 = uVar37;
                if ((long)uVar37 < (long)uVar44) {
                  uStack_70 = uVar44;
                }
                auVar73._8_8_ = -(ulong)((long)uVar37 < (long)uVar44);
                auVar73._0_8_ = -(ulong)((long)uVar33 < (long)uVar38);
                local_2a8 = pblendvb(auVar66,local_58,auVar73);
                local_f8 = pblendvb(auVar63,local_48,auVar73);
                uVar64 = uVar64 - (uint)open;
                uVar44 = local_68 - (uint)open;
                uVar37 = local_228._0_8_ - local_c8._0_8_;
                uVar38 = local_228._8_8_ - local_c8._8_8_;
                uVar33 = uVar37;
                if ((long)uVar37 < (long)uVar64) {
                  uVar33 = uVar64;
                }
                uVar14 = uVar38;
                if ((long)uVar38 < (long)uVar44) {
                  uVar14 = uVar44;
                }
                uStack_1b0 = ptr_00[uVar19 + 1];
                lVar28 = (long)(local_130 + uVar22 * (long)iVar21)[uStack_1b0];
                lVar30 = (long)(local_130 + uVar26 * (long)iVar21)[ptr_00[uVar19]];
                auVar65._8_8_ = ptr_08[uVar19 + 1];
                auVar65._0_8_ = local_238._8_8_;
                uVar39 = lVar30 + uVar39;
                uVar45 = lVar28 + uVar45;
                auVar66 = pblendvb(auVar65,local_1c8,auVar73);
                uVar24 = uVar33;
                if ((long)uVar33 < (long)uVar39) {
                  uVar24 = uVar39;
                }
                uVar15 = uVar14;
                if ((long)uVar14 < (long)uVar45) {
                  uVar15 = uVar45;
                }
                auVar47._8_8_ = -(ulong)((long)uVar38 < (long)uVar44);
                auVar47._0_8_ = -(ulong)((long)uVar37 < (long)uVar64);
                local_1e8 = pblendvb(auVar61,local_e8,auVar47);
                local_1d8 = pblendvb(auVar46,auVar68,auVar47);
                if ((long)uVar24 <= (long)local_78) {
                  uVar24 = local_78;
                }
                if ((long)uVar15 <= (long)uStack_70) {
                  uVar15 = uStack_70;
                }
                if ((long)uVar24 < 1) {
                  uVar24 = 0;
                }
                if ((long)uVar15 < 1) {
                  uVar15 = 0;
                }
                auVar61 = pblendvb(auVar62,auVar71,auVar47);
                local_1f8._8_8_ = uVar15;
                local_1f8._0_8_ = uVar24;
                auVar46._0_8_ = -(ulong)(uVar39 == uVar24);
                auVar46._8_8_ = -(ulong)(uVar45 == uVar15);
                auVar71._0_8_ = -(ulong)(uVar24 == local_78);
                auVar71._8_8_ = -(ulong)(uVar15 == uStack_70);
                auVar62 = blendvpd(local_1e8,local_2a8,auVar71);
                local_1b8 = uVar29;
                auVar68._0_8_ = lVar69 + (ulong)(local_98 == uVar29);
                auVar68._8_8_ = lVar70 + (ulong)(uStack_90 == uStack_1b0);
                local_e8 = blendvpd(auVar62,auVar68,auVar46);
                auVar62 = blendvpd(local_1d8,local_f8,auVar71);
                auVar54._0_8_ = (ulong)(0 < lVar30) + lVar56;
                auVar54._8_8_ = (ulong)(0 < lVar28) + lVar43;
                auVar68 = blendvpd(auVar62,auVar54,auVar46);
                auVar55._8_4_ = 0xffffffff;
                auVar55._0_8_ = 0xffffffffffffffff;
                auVar55._12_4_ = 0xffffffff;
                local_238._0_8_ = auVar66._0_8_ + 1;
                lVar56 = auVar55._8_8_;
                local_238._8_8_ = auVar66._8_8_ - lVar56;
                auVar62._0_8_ = auVar61._0_8_ + 1;
                auVar62._8_8_ = auVar61._8_8_ - lVar56;
                auVar71 = blendvpd(auVar62,local_238,auVar71);
                auVar58._0_8_ = lVar57 + 1;
                auVar58._8_8_ = lVar59 - lVar56;
                auVar71 = blendvpd(auVar71,auVar58,auVar46);
                local_88._0_8_ = -(ulong)(lVar53 == -1);
                local_88._8_8_ = -(ulong)(lStack_2b0 == lVar56);
                local_1f8 = ~local_88 & local_1f8;
                auVar72._8_8_ = uVar14;
                auVar72._0_8_ = uVar33;
                auVar61._0_8_ = -(ulong)(uVar24 == 0);
                auVar61._8_8_ = -(ulong)(uVar15 == 0);
                auVar61 = auVar61 | local_88;
                local_e8 = ~auVar61 & local_e8;
                auVar68 = ~auVar61 & auVar68;
                auVar71 = ~auVar61 & auVar71;
                local_228 = blendvpd(auVar72,auVar34,local_88);
                uVar33 = local_1f8._8_8_;
                uVar64 = local_1f8._0_8_;
                uVar45 = local_e8._0_8_;
                uVar39 = auVar68._0_8_;
                uVar29 = auVar71._0_8_;
                if (1 < uVar19) {
                  if ((long)uVar64 <= (long)local_208._0_8_) {
                    local_208._0_8_ = uVar64;
                  }
                  if ((long)uVar33 <= (long)local_208._8_8_) {
                    local_208._8_8_ = uVar33;
                  }
                  uVar37 = uVar64;
                  if ((long)uVar64 < (long)local_248) {
                    uVar37 = local_248;
                  }
                  uVar38 = uVar33;
                  if ((long)uVar33 < (long)uStack_240) {
                    uVar38 = uStack_240;
                  }
                  if ((long)uVar37 <= (long)uVar45) {
                    uVar37 = uVar45;
                  }
                  if ((long)uVar38 <= (long)local_e8._8_8_) {
                    uVar38 = local_e8._8_8_;
                  }
                  if ((long)uVar37 <= (long)uVar39) {
                    uVar37 = uVar39;
                  }
                  if ((long)uVar38 <= (long)auVar68._8_8_) {
                    uVar38 = auVar68._8_8_;
                  }
                  if ((long)uVar37 <= (long)uVar29) {
                    uVar37 = uVar29;
                  }
                  if ((long)uVar38 <= (long)auVar71._8_8_) {
                    uVar38 = auVar71._8_8_;
                  }
                  local_248 = uVar37;
                  uStack_240 = uVar38;
                }
                lVar57 = *((ppVar10->field_4).trace)->trace_del_table;
                if (uVar19 < uVar16) {
                  *(int *)(lVar57 + lVar20 + uVar19 * 4) = local_1f8._8_4_;
                }
                bVar31 = local_110 < uVar25;
                bVar32 = uVar19 != 0;
                if (bVar32 && bVar31) {
                  *(int *)(lVar57 + lVar23 + uVar19 * 4) = local_1f8._0_4_;
                }
                lVar57 = *(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 8);
                if (uVar19 < uVar16) {
                  *(int *)(lVar57 + lVar20 + uVar19 * 4) = local_e8._8_4_;
                }
                if (bVar32 && bVar31) {
                  *(int *)(lVar57 + lVar23 + uVar19 * 4) = local_e8._0_4_;
                }
                lVar57 = *(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x10);
                if (uVar19 < uVar16) {
                  *(int *)(lVar57 + lVar20 + uVar19 * 4) = auVar68._8_4_;
                }
                if (bVar32 && bVar31) {
                  *(int *)(lVar57 + lVar23 + uVar19 * 4) = auVar68._0_4_;
                }
                lVar57 = *(long *)((long)((ppVar10->field_4).trace)->trace_del_table + 0x18);
                if (uVar19 < uVar16) {
                  *(int *)(lVar57 + lVar20 + uVar19 * 4) = auVar71._8_4_;
                }
                if (bVar32 && bVar31) {
                  *(int *)(lVar57 + lVar23 + uVar19 * 4) = auVar71._0_4_;
                }
                ptr_01[uVar19] = uVar64;
                ptr_02[uVar19] = uVar45;
                ptr_03[uVar19] = uVar39;
                ptr_04[uVar19] = uVar29;
                ptr_05[uVar19] = local_78;
                ptr_06[uVar19] = local_2a8._0_8_;
                ptr_07[uVar19] = local_f8._0_8_;
                ptr_08[uVar19] = local_238._0_8_;
                auVar5._8_8_ = lStack_2b0;
                auVar5._0_8_ = lVar53;
                auVar48._0_8_ = -(ulong)(SUB168(auVar5 ^ _DAT_008d0ba0,0) < 0);
                auVar48._8_8_ = -(ulong)(SUB168(auVar5 ^ _DAT_008d0ba0,8) < 0);
                auVar6._8_8_ = lStack_a0;
                auVar6._0_8_ = local_a8;
                auVar60._8_8_ = -(ulong)(lStack_2b0 < (long)uVar16);
                auVar60._0_8_ = -(ulong)(lVar53 < (long)uVar16);
                auVar60 = auVar60 & auVar48 & auVar6;
                auVar51._0_8_ = -(ulong)(uVar64 == local_168._0_8_);
                auVar51._8_8_ = -(ulong)(uVar33 == local_168._8_8_);
                auVar35._0_8_ = -(ulong)((long)local_168._0_8_ < (long)uVar64);
                auVar35._8_8_ = -(ulong)((long)local_168._8_8_ < (long)uVar33);
                uVar12 = movmskpd((int)-(ulong)(lStack_2b0 < (long)uVar16),auVar35);
                auVar36._8_8_ = -(ulong)(byte)((byte)uVar12 >> 1);
                auVar36._0_8_ = -(ulong)(uVar12 & 1);
                auVar36 = auVar36 & auVar60;
                auVar49._0_8_ = -(ulong)(lVar53 < local_218._0_8_);
                auVar49._8_8_ = -(ulong)(lStack_2b0 < local_218._8_8_);
                uVar12 = movmskpd((int)-(ulong)(uVar12 & 1),auVar49);
                local_168 = pblendvb(local_168,local_1f8,auVar36);
                auVar61 = pblendvb(local_178,local_e8,auVar36);
                auVar73 = pblendvb(local_188,auVar68,auVar36);
                auVar50._8_8_ = -(ulong)(byte)((byte)uVar12 >> 1);
                auVar50._0_8_ = -(ulong)(uVar12 & 1);
                auVar46 = pblendvb(local_198,auVar71,auVar36);
                auVar66 = pblendvb(local_1a8,auVar40,auVar36);
                auVar63 = pblendvb(local_218,auVar5,auVar36);
                auVar51 = auVar50 & auVar60 & auVar51;
                local_178 = pblendvb(auVar61,local_e8,auVar51);
                auVar67._8_4_ = 0xffffffff;
                auVar67._0_8_ = 0xffffffffffffffff;
                auVar67._12_4_ = 0xffffffff;
                auVar61 = ~local_88 & local_1e8;
                local_188 = pblendvb(auVar73,auVar68,auVar51);
                local_198 = pblendvb(auVar46,auVar71,auVar51);
                auVar46 = ~local_88 & local_1d8;
                local_1a8 = pblendvb(auVar66,auVar40,auVar51);
                auVar62 = ~local_88 & auVar62;
                local_218 = pblendvb(auVar63,auVar5,auVar51);
                lVar53 = lVar53 + 1;
                lStack_2b0 = lStack_2b0 - auVar67._8_8_;
                uVar19 = uVar19 + 1;
                lVar57 = local_1c8._0_8_;
                lVar59 = iVar4;
                uVar29 = uStack_1b0;
                uVar39 = local_68;
                uVar45 = uStack_60;
                lVar56 = local_48._0_8_;
                lVar43 = iVar3;
                lVar69 = local_58._0_8_;
                lVar70 = iVar2;
              } while (s2Len + 1 != uVar19);
              auVar40._0_8_ = auVar40._0_8_ + 2;
              auVar40._8_8_ = lVar42 + 2;
              uVar18 = uVar18 + 2;
              lVar20 = lVar20 + local_138;
              lVar23 = lVar23 + local_138;
            } while (uVar18 < uVar25);
          }
          local_268 = local_178;
          local_278 = local_188;
          local_288 = local_198;
          local_298 = local_1a8;
          lVar23 = 0;
          iVar21 = 0;
          uVar22 = 0;
          uVar16 = uVar11;
          uVar25 = uVar11;
          uVar18 = uVar11;
          do {
            uVar26 = *(ulong *)(local_168 + lVar23 * 8);
            if ((long)uVar18 < (long)uVar26) {
              uVar16 = *(ulong *)(local_268 + lVar23 * 8);
              uVar25 = *(ulong *)(local_278 + lVar23 * 8);
              uVar11 = *(ulong *)(local_288 + lVar23 * 8);
              iVar21 = *(int *)(local_298 + lVar23 * 8);
              uVar22 = (ulong)*(uint *)(local_218 + lVar23 * 8);
              uVar18 = uVar26;
            }
            else if (uVar26 == uVar18) {
              uVar26 = *(ulong *)(local_218 + lVar23 * 8);
              if ((long)uVar26 < (long)(int)uVar22) {
                uVar16 = *(ulong *)(local_268 + lVar23 * 8);
                uVar25 = *(ulong *)(local_278 + lVar23 * 8);
                uVar11 = *(ulong *)(local_288 + lVar23 * 8);
                iVar21 = *(int *)(local_298 + lVar23 * 8);
              }
              else {
                if ((uVar26 != (long)(int)uVar22) ||
                   ((long)iVar21 <= *(long *)(local_298 + lVar23 * 8))) goto LAB_006bb05a;
                uVar16 = *(ulong *)(local_268 + lVar23 * 8);
                uVar25 = *(ulong *)(local_278 + lVar23 * 8);
                uVar11 = *(ulong *)(local_288 + lVar23 * 8);
                iVar21 = (int)*(long *)(local_298 + lVar23 * 8);
              }
              uVar22 = uVar26 & 0xffffffff;
            }
LAB_006bb05a:
            iVar9 = (int)uVar11;
            iVar17 = (int)uVar25;
            iVar13 = (int)uVar16;
            lVar23 = lVar23 + 1;
            if ((int)lVar23 != 1) {
              auVar41._8_8_ = -(ulong)((long)local_208._8_8_ <= (long)local_148);
              auVar41._0_8_ = -(ulong)((long)local_208._0_8_ <= (long)local_148);
              iVar27 = (int)uVar22;
              auVar52._8_8_ = -(ulong)(local_158 < (long)uStack_240);
              auVar52._0_8_ = -(ulong)(local_158 < (long)local_248);
              auVar52 = auVar52 | auVar41;
              if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar52 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar52 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar52 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar52 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar52 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar52 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar52 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar52 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar52 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar52 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar52 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar52[0xf] < '\0') {
                *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                iVar21 = 0;
                iVar27 = 0;
                uVar18 = 0;
                iVar13 = 0;
                iVar17 = 0;
                iVar9 = 0;
              }
              ppVar10->score = (int)uVar18;
              ppVar10->end_query = iVar21;
              ppVar10->end_ref = iVar27;
              ((ppVar10->field_4).stats)->matches = iVar13;
              ((ppVar10->field_4).stats)->similar = iVar17;
              ((ppVar10->field_4).stats)->length = iVar9;
              local_c8 = auVar8;
              parasail_free(ptr_08);
              parasail_free(ptr_07);
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar10;
            }
          } while( true );
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i case0 = vZero;
        __m128i vNH = vNegInf0;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf0;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            case0 = _mm_cmpeq_epi64(vWH, vZero);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm_blendv_epi8(vWM, vZero, case0);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(vWS, vZero, case0);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            vWL = _mm_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *m = (int64_t*)&vMaxM;
        int64_t *s = (int64_t*)&vMaxS;
        int64_t *l = (int64_t*)&vMaxL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}